

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack13_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar4 = *in;
  auVar6 = vpmovsxbd_avx(ZEXT416(0x1000004));
  uVar1 = in[3];
  *out = uVar4 & 0x1fff;
  uVar2 = *(ulong *)(in + 1);
  out[1] = uVar4 >> 0xd & 0x1fff;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar2;
  auVar7 = vpsllvd_avx2(auVar8,_DAT_001983e0);
  auVar5._8_4_ = 0x1fc0;
  auVar5._0_8_ = 0x100000001fc0;
  auVar5._12_4_ = 0x1000;
  auVar5 = vpandq_avx512vl(auVar7,auVar5);
  auVar6 = vpermi2d_avx512vl(auVar6,auVar8,ZEXT416(uVar4));
  auVar7 = vpsrlvd_avx2(auVar6,_DAT_001a4220);
  uVar4 = (uint)(uVar2 >> 0x20);
  auVar6 = vpmovzxdq_avx(auVar5);
  auVar6 = vpor_avx(auVar7,auVar6);
  auVar3._8_4_ = 0x1fff;
  auVar3._0_8_ = 0x1fff00001fff;
  auVar3._12_4_ = 0x1fff;
  auVar7 = vpandd_avx512vl(auVar7,auVar3);
  auVar6 = vpblendd_avx2(auVar6,auVar7,10);
  *(undefined1 (*) [16])(out + 2) = auVar6;
  out[6] = uVar4 >> 0xe & 0x1fff;
  out[7] = (uVar1 & 0xff) << 5 | uVar4 >> 0x1b;
  return in + 4;
}

Assistant:

const uint32_t *__fastunpack13_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 13);
  out++;
  *out = ((*in) >> 13) % (1U << 13);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 7)) << (13 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 13);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 1)) << (13 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 13);
  out++;
  *out = ((*in) >> 14) % (1U << 13);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 8)) << (13 - 8);
  out++;

  return in + 1;
}